

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::StartAt
          (LocationRecorder *this,LocationRecorder *other)

{
  Location *pLVar1;
  int32_t iVar2;
  pointer piVar3;
  
  pLVar1 = this->location_;
  iVar2 = SourceCodeInfo_Location::span(other->location_,0);
  piVar3 = RepeatedField<int>::Mutable(&(pLVar1->field_0)._impl_.span_,0);
  *piVar3 = iVar2;
  pLVar1 = this->location_;
  iVar2 = SourceCodeInfo_Location::span(other->location_,1);
  piVar3 = RepeatedField<int>::Mutable(&(pLVar1->field_0)._impl_.span_,1);
  *piVar3 = iVar2;
  return;
}

Assistant:

void Parser::LocationRecorder::StartAt(const LocationRecorder& other) {
  location_->set_span(0, other.location_->span(0));
  location_->set_span(1, other.location_->span(1));
}